

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O3

void add_generator<trng::mrg5>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>_>_>_>
                *func_map)

{
  char *pcVar1;
  mapped_type *this;
  mrg5 r;
  allocator local_5a;
  anon_class_1_0_00000001 local_59;
  key_type local_58;
  mrg5 local_38;
  
  trng::mrg5::mrg5(&local_38,(parameter_type *)trng::mrg5::LEcuyer1);
  pcVar1 = trng::mrg5::name();
  std::__cxx11::string::string((string *)&local_58,pcVar1,&local_5a);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>_>_>_>
         ::operator[](func_map,&local_58);
  std::function<void(unsigned_long,unsigned_long)>::operator=
            ((function<void(unsigned_long,unsigned_long)> *)this,&local_59);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void add_generator(
    std::map<std::string, std::function<void(std::size_t, unsigned long)>> &func_map) {
  const R r;
  func_map[r.name()] = [&](std::size_t samples, unsigned long seed) {
    generate<R>(samples, seed);
  };
}